

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SUN_vertex(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SUN_vertex != 0) {
    glad_glColor4ubVertex2fSUN = (PFNGLCOLOR4UBVERTEX2FSUNPROC)(*load)("glColor4ubVertex2fSUN");
    glad_glColor4ubVertex2fvSUN = (PFNGLCOLOR4UBVERTEX2FVSUNPROC)(*load)("glColor4ubVertex2fvSUN");
    glad_glColor4ubVertex3fSUN = (PFNGLCOLOR4UBVERTEX3FSUNPROC)(*load)("glColor4ubVertex3fSUN");
    glad_glColor4ubVertex3fvSUN = (PFNGLCOLOR4UBVERTEX3FVSUNPROC)(*load)("glColor4ubVertex3fvSUN");
    glad_glColor3fVertex3fSUN = (PFNGLCOLOR3FVERTEX3FSUNPROC)(*load)("glColor3fVertex3fSUN");
    glad_glColor3fVertex3fvSUN = (PFNGLCOLOR3FVERTEX3FVSUNPROC)(*load)("glColor3fVertex3fvSUN");
    glad_glNormal3fVertex3fSUN = (PFNGLNORMAL3FVERTEX3FSUNPROC)(*load)("glNormal3fVertex3fSUN");
    glad_glNormal3fVertex3fvSUN = (PFNGLNORMAL3FVERTEX3FVSUNPROC)(*load)("glNormal3fVertex3fvSUN");
    glad_glColor4fNormal3fVertex3fSUN =
         (PFNGLCOLOR4FNORMAL3FVERTEX3FSUNPROC)(*load)("glColor4fNormal3fVertex3fSUN");
    glad_glColor4fNormal3fVertex3fvSUN =
         (PFNGLCOLOR4FNORMAL3FVERTEX3FVSUNPROC)(*load)("glColor4fNormal3fVertex3fvSUN");
    glad_glTexCoord2fVertex3fSUN =
         (PFNGLTEXCOORD2FVERTEX3FSUNPROC)(*load)("glTexCoord2fVertex3fSUN");
    glad_glTexCoord2fVertex3fvSUN =
         (PFNGLTEXCOORD2FVERTEX3FVSUNPROC)(*load)("glTexCoord2fVertex3fvSUN");
    glad_glTexCoord4fVertex4fSUN =
         (PFNGLTEXCOORD4FVERTEX4FSUNPROC)(*load)("glTexCoord4fVertex4fSUN");
    glad_glTexCoord4fVertex4fvSUN =
         (PFNGLTEXCOORD4FVERTEX4FVSUNPROC)(*load)("glTexCoord4fVertex4fvSUN");
    glad_glTexCoord2fColor4ubVertex3fSUN =
         (PFNGLTEXCOORD2FCOLOR4UBVERTEX3FSUNPROC)(*load)("glTexCoord2fColor4ubVertex3fSUN");
    glad_glTexCoord2fColor4ubVertex3fvSUN =
         (PFNGLTEXCOORD2FCOLOR4UBVERTEX3FVSUNPROC)(*load)("glTexCoord2fColor4ubVertex3fvSUN");
    glad_glTexCoord2fColor3fVertex3fSUN =
         (PFNGLTEXCOORD2FCOLOR3FVERTEX3FSUNPROC)(*load)("glTexCoord2fColor3fVertex3fSUN");
    glad_glTexCoord2fColor3fVertex3fvSUN =
         (PFNGLTEXCOORD2FCOLOR3FVERTEX3FVSUNPROC)(*load)("glTexCoord2fColor3fVertex3fvSUN");
    glad_glTexCoord2fNormal3fVertex3fSUN =
         (PFNGLTEXCOORD2FNORMAL3FVERTEX3FSUNPROC)(*load)("glTexCoord2fNormal3fVertex3fSUN");
    glad_glTexCoord2fNormal3fVertex3fvSUN =
         (PFNGLTEXCOORD2FNORMAL3FVERTEX3FVSUNPROC)(*load)("glTexCoord2fNormal3fVertex3fvSUN");
    glad_glTexCoord2fColor4fNormal3fVertex3fSUN =
         (PFNGLTEXCOORD2FCOLOR4FNORMAL3FVERTEX3FSUNPROC)
         (*load)("glTexCoord2fColor4fNormal3fVertex3fSUN");
    glad_glTexCoord2fColor4fNormal3fVertex3fvSUN =
         (PFNGLTEXCOORD2FCOLOR4FNORMAL3FVERTEX3FVSUNPROC)
         (*load)("glTexCoord2fColor4fNormal3fVertex3fvSUN");
    glad_glTexCoord4fColor4fNormal3fVertex4fSUN =
         (PFNGLTEXCOORD4FCOLOR4FNORMAL3FVERTEX4FSUNPROC)
         (*load)("glTexCoord4fColor4fNormal3fVertex4fSUN");
    glad_glTexCoord4fColor4fNormal3fVertex4fvSUN =
         (PFNGLTEXCOORD4FCOLOR4FNORMAL3FVERTEX4FVSUNPROC)
         (*load)("glTexCoord4fColor4fNormal3fVertex4fvSUN");
    glad_glReplacementCodeuiVertex3fSUN =
         (PFNGLREPLACEMENTCODEUIVERTEX3FSUNPROC)(*load)("glReplacementCodeuiVertex3fSUN");
    glad_glReplacementCodeuiVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUIVERTEX3FVSUNPROC)(*load)("glReplacementCodeuiVertex3fvSUN");
    glad_glReplacementCodeuiColor4ubVertex3fSUN =
         (PFNGLREPLACEMENTCODEUICOLOR4UBVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiColor4ubVertex3fSUN");
    glad_glReplacementCodeuiColor4ubVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUICOLOR4UBVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiColor4ubVertex3fvSUN");
    glad_glReplacementCodeuiColor3fVertex3fSUN =
         (PFNGLREPLACEMENTCODEUICOLOR3FVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiColor3fVertex3fSUN");
    glad_glReplacementCodeuiColor3fVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUICOLOR3FVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiColor3fVertex3fvSUN");
    glad_glReplacementCodeuiNormal3fVertex3fSUN =
         (PFNGLREPLACEMENTCODEUINORMAL3FVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiNormal3fVertex3fSUN");
    glad_glReplacementCodeuiNormal3fVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUINORMAL3FVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiNormal3fVertex3fvSUN");
    glad_glReplacementCodeuiColor4fNormal3fVertex3fSUN =
         (PFNGLREPLACEMENTCODEUICOLOR4FNORMAL3FVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiColor4fNormal3fVertex3fSUN");
    glad_glReplacementCodeuiColor4fNormal3fVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUICOLOR4FNORMAL3FVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiColor4fNormal3fVertex3fvSUN");
    glad_glReplacementCodeuiTexCoord2fVertex3fSUN =
         (PFNGLREPLACEMENTCODEUITEXCOORD2FVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiTexCoord2fVertex3fSUN");
    glad_glReplacementCodeuiTexCoord2fVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUITEXCOORD2FVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiTexCoord2fVertex3fvSUN");
    glad_glReplacementCodeuiTexCoord2fNormal3fVertex3fSUN =
         (PFNGLREPLACEMENTCODEUITEXCOORD2FNORMAL3FVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiTexCoord2fNormal3fVertex3fSUN");
    glad_glReplacementCodeuiTexCoord2fNormal3fVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUITEXCOORD2FNORMAL3FVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiTexCoord2fNormal3fVertex3fvSUN");
    glad_glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fSUN =
         (PFNGLREPLACEMENTCODEUITEXCOORD2FCOLOR4FNORMAL3FVERTEX3FSUNPROC)
         (*load)("glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fSUN");
    glad_glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fvSUN =
         (PFNGLREPLACEMENTCODEUITEXCOORD2FCOLOR4FNORMAL3FVERTEX3FVSUNPROC)
         (*load)("glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fvSUN");
  }
  return;
}

Assistant:

static void load_GL_SUN_vertex(GLADloadproc load) {
	if(!GLAD_GL_SUN_vertex) return;
	glad_glColor4ubVertex2fSUN = (PFNGLCOLOR4UBVERTEX2FSUNPROC)load("glColor4ubVertex2fSUN");
	glad_glColor4ubVertex2fvSUN = (PFNGLCOLOR4UBVERTEX2FVSUNPROC)load("glColor4ubVertex2fvSUN");
	glad_glColor4ubVertex3fSUN = (PFNGLCOLOR4UBVERTEX3FSUNPROC)load("glColor4ubVertex3fSUN");
	glad_glColor4ubVertex3fvSUN = (PFNGLCOLOR4UBVERTEX3FVSUNPROC)load("glColor4ubVertex3fvSUN");
	glad_glColor3fVertex3fSUN = (PFNGLCOLOR3FVERTEX3FSUNPROC)load("glColor3fVertex3fSUN");
	glad_glColor3fVertex3fvSUN = (PFNGLCOLOR3FVERTEX3FVSUNPROC)load("glColor3fVertex3fvSUN");
	glad_glNormal3fVertex3fSUN = (PFNGLNORMAL3FVERTEX3FSUNPROC)load("glNormal3fVertex3fSUN");
	glad_glNormal3fVertex3fvSUN = (PFNGLNORMAL3FVERTEX3FVSUNPROC)load("glNormal3fVertex3fvSUN");
	glad_glColor4fNormal3fVertex3fSUN = (PFNGLCOLOR4FNORMAL3FVERTEX3FSUNPROC)load("glColor4fNormal3fVertex3fSUN");
	glad_glColor4fNormal3fVertex3fvSUN = (PFNGLCOLOR4FNORMAL3FVERTEX3FVSUNPROC)load("glColor4fNormal3fVertex3fvSUN");
	glad_glTexCoord2fVertex3fSUN = (PFNGLTEXCOORD2FVERTEX3FSUNPROC)load("glTexCoord2fVertex3fSUN");
	glad_glTexCoord2fVertex3fvSUN = (PFNGLTEXCOORD2FVERTEX3FVSUNPROC)load("glTexCoord2fVertex3fvSUN");
	glad_glTexCoord4fVertex4fSUN = (PFNGLTEXCOORD4FVERTEX4FSUNPROC)load("glTexCoord4fVertex4fSUN");
	glad_glTexCoord4fVertex4fvSUN = (PFNGLTEXCOORD4FVERTEX4FVSUNPROC)load("glTexCoord4fVertex4fvSUN");
	glad_glTexCoord2fColor4ubVertex3fSUN = (PFNGLTEXCOORD2FCOLOR4UBVERTEX3FSUNPROC)load("glTexCoord2fColor4ubVertex3fSUN");
	glad_glTexCoord2fColor4ubVertex3fvSUN = (PFNGLTEXCOORD2FCOLOR4UBVERTEX3FVSUNPROC)load("glTexCoord2fColor4ubVertex3fvSUN");
	glad_glTexCoord2fColor3fVertex3fSUN = (PFNGLTEXCOORD2FCOLOR3FVERTEX3FSUNPROC)load("glTexCoord2fColor3fVertex3fSUN");
	glad_glTexCoord2fColor3fVertex3fvSUN = (PFNGLTEXCOORD2FCOLOR3FVERTEX3FVSUNPROC)load("glTexCoord2fColor3fVertex3fvSUN");
	glad_glTexCoord2fNormal3fVertex3fSUN = (PFNGLTEXCOORD2FNORMAL3FVERTEX3FSUNPROC)load("glTexCoord2fNormal3fVertex3fSUN");
	glad_glTexCoord2fNormal3fVertex3fvSUN = (PFNGLTEXCOORD2FNORMAL3FVERTEX3FVSUNPROC)load("glTexCoord2fNormal3fVertex3fvSUN");
	glad_glTexCoord2fColor4fNormal3fVertex3fSUN = (PFNGLTEXCOORD2FCOLOR4FNORMAL3FVERTEX3FSUNPROC)load("glTexCoord2fColor4fNormal3fVertex3fSUN");
	glad_glTexCoord2fColor4fNormal3fVertex3fvSUN = (PFNGLTEXCOORD2FCOLOR4FNORMAL3FVERTEX3FVSUNPROC)load("glTexCoord2fColor4fNormal3fVertex3fvSUN");
	glad_glTexCoord4fColor4fNormal3fVertex4fSUN = (PFNGLTEXCOORD4FCOLOR4FNORMAL3FVERTEX4FSUNPROC)load("glTexCoord4fColor4fNormal3fVertex4fSUN");
	glad_glTexCoord4fColor4fNormal3fVertex4fvSUN = (PFNGLTEXCOORD4FCOLOR4FNORMAL3FVERTEX4FVSUNPROC)load("glTexCoord4fColor4fNormal3fVertex4fvSUN");
	glad_glReplacementCodeuiVertex3fSUN = (PFNGLREPLACEMENTCODEUIVERTEX3FSUNPROC)load("glReplacementCodeuiVertex3fSUN");
	glad_glReplacementCodeuiVertex3fvSUN = (PFNGLREPLACEMENTCODEUIVERTEX3FVSUNPROC)load("glReplacementCodeuiVertex3fvSUN");
	glad_glReplacementCodeuiColor4ubVertex3fSUN = (PFNGLREPLACEMENTCODEUICOLOR4UBVERTEX3FSUNPROC)load("glReplacementCodeuiColor4ubVertex3fSUN");
	glad_glReplacementCodeuiColor4ubVertex3fvSUN = (PFNGLREPLACEMENTCODEUICOLOR4UBVERTEX3FVSUNPROC)load("glReplacementCodeuiColor4ubVertex3fvSUN");
	glad_glReplacementCodeuiColor3fVertex3fSUN = (PFNGLREPLACEMENTCODEUICOLOR3FVERTEX3FSUNPROC)load("glReplacementCodeuiColor3fVertex3fSUN");
	glad_glReplacementCodeuiColor3fVertex3fvSUN = (PFNGLREPLACEMENTCODEUICOLOR3FVERTEX3FVSUNPROC)load("glReplacementCodeuiColor3fVertex3fvSUN");
	glad_glReplacementCodeuiNormal3fVertex3fSUN = (PFNGLREPLACEMENTCODEUINORMAL3FVERTEX3FSUNPROC)load("glReplacementCodeuiNormal3fVertex3fSUN");
	glad_glReplacementCodeuiNormal3fVertex3fvSUN = (PFNGLREPLACEMENTCODEUINORMAL3FVERTEX3FVSUNPROC)load("glReplacementCodeuiNormal3fVertex3fvSUN");
	glad_glReplacementCodeuiColor4fNormal3fVertex3fSUN = (PFNGLREPLACEMENTCODEUICOLOR4FNORMAL3FVERTEX3FSUNPROC)load("glReplacementCodeuiColor4fNormal3fVertex3fSUN");
	glad_glReplacementCodeuiColor4fNormal3fVertex3fvSUN = (PFNGLREPLACEMENTCODEUICOLOR4FNORMAL3FVERTEX3FVSUNPROC)load("glReplacementCodeuiColor4fNormal3fVertex3fvSUN");
	glad_glReplacementCodeuiTexCoord2fVertex3fSUN = (PFNGLREPLACEMENTCODEUITEXCOORD2FVERTEX3FSUNPROC)load("glReplacementCodeuiTexCoord2fVertex3fSUN");
	glad_glReplacementCodeuiTexCoord2fVertex3fvSUN = (PFNGLREPLACEMENTCODEUITEXCOORD2FVERTEX3FVSUNPROC)load("glReplacementCodeuiTexCoord2fVertex3fvSUN");
	glad_glReplacementCodeuiTexCoord2fNormal3fVertex3fSUN = (PFNGLREPLACEMENTCODEUITEXCOORD2FNORMAL3FVERTEX3FSUNPROC)load("glReplacementCodeuiTexCoord2fNormal3fVertex3fSUN");
	glad_glReplacementCodeuiTexCoord2fNormal3fVertex3fvSUN = (PFNGLREPLACEMENTCODEUITEXCOORD2FNORMAL3FVERTEX3FVSUNPROC)load("glReplacementCodeuiTexCoord2fNormal3fVertex3fvSUN");
	glad_glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fSUN = (PFNGLREPLACEMENTCODEUITEXCOORD2FCOLOR4FNORMAL3FVERTEX3FSUNPROC)load("glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fSUN");
	glad_glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fvSUN = (PFNGLREPLACEMENTCODEUITEXCOORD2FCOLOR4FNORMAL3FVERTEX3FVSUNPROC)load("glReplacementCodeuiTexCoord2fColor4fNormal3fVertex3fvSUN");
}